

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O3

void search_wiener(RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
                  RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  short *psVar1;
  short sVar2;
  int iVar3;
  aom_bit_depth_t aVar4;
  long lVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  int16_t iVar11;
  short sVar12;
  int i;
  uint wiener_win;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint64_t uVar22;
  _func_void_int_uint8_t_ptr_uint8_t_ptr_int16_t_ptr_int16_t_ptr_int_int_int_int_int_int_int64_t_ptr_int64_t_ptr_aom_bit_depth_t
  **pp_Var23;
  ulong uVar25;
  long lVar26;
  byte bVar27;
  undefined2 uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  long *plVar32;
  long lVar33;
  int64_t **ppiVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  int p;
  long lVar38;
  int iVar39;
  int iVar40;
  int64_t *piVar41;
  int64_t iVar42;
  ulong uVar43;
  int iVar44;
  int64_t *piVar45;
  ulong uVar46;
  long lVar47;
  uint uVar48;
  long lVar49;
  ulong uVar50;
  bool bVar51;
  WienerInfo *wiener_info;
  ulong uVar52;
  ushort uVar53;
  ushort uVar56;
  undefined4 uVar54;
  double dVar55;
  int64_t B [16];
  int wiener_halfwin;
  int64_t A [4];
  int64_t S [7];
  int32_t hfilter [7];
  int32_t vfilter [7];
  int64_t *Mc [7];
  int32_t b2 [7];
  int32_t b1 [7];
  int64_t *Hc [49];
  int64_t M [49];
  int64_t H [2401];
  uint n;
  ulong uVar24;
  ushort uVar57;
  
  lVar5 = *(long *)((long)priv + 0x18);
  lVar33 = *(long *)((long)priv + 0x38);
  uVar50 = (ulong)*(int *)(lVar5 + 0xb93c);
  wiener_info = (WienerInfo *)((long)rest_unit_idx * 0x40 + *(long *)((long)priv + 0x30));
  if (*(int *)(lVar33 + 0x2c) != 0) {
    iVar11 = av1_dc_quant_QTX(*(int *)(*(long *)((long)priv + 0x10) + 0x268),0,
                              *(aom_bit_depth_t *)
                               (*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x48));
    iVar3 = *(int *)(&DAT_005043b8 + (long)*(int *)(*(long *)((long)priv + 0x38) + 0x2c) * 4);
    uVar22 = (*var_part_extractors
               [(ulong)*(byte *)(*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x4c) * 3 +
                (long)*(int *)((long)priv + 0x20)])
                       (*priv,limits->h_start,limits->h_end - limits->h_start,limits->v_start,
                        limits->v_end - limits->v_start);
    lVar33 = *(long *)((long)priv + 0x60);
    if (uVar22 < (ulong)(long)(((int)iVar11 >> 3) * ((int)iVar11 >> 3) * iVar3 >> 4)) {
LAB_002034b6:
      *(long *)((long)priv + 0xa8) = *(long *)((long)priv + 0xa8) + uVar50;
      *(long *)((long)priv + 0x88) = *(long *)((long)priv + 0x88) + lVar33;
      wiener_info[1].vfilter[6] = 0;
      wiener_info[1].vfilter[7] = 0;
      *(undefined8 *)((long)priv + 0x68) = 0x7fffffffffffffff;
      if (*(int *)(*(long *)((long)priv + 0x38) + 0x30) != 2) {
        return;
      }
      *(undefined1 *)((long)priv + 0x78) = 1;
      return;
    }
    if (lVar33 == 0) {
      lVar33 = 0;
      goto LAB_002034b6;
    }
    lVar33 = *(long *)((long)priv + 0x38);
  }
  iVar3 = *(int *)((long)priv + 0x20);
  wiener_win = (uint)(iVar3 == 0) * 2 + 5;
  iVar21 = *(int *)(lVar33 + 0x34);
  uVar52 = 5;
  if (iVar21 == 0) {
    uVar52 = (ulong)wiener_win;
  }
  lVar26 = *(long *)(*(long *)((long)priv + 0x10) + 0x6088);
  if (*(char *)(lVar26 + 0x4c) == '\0') {
    aVar4 = *(aom_bit_depth_t *)(lVar33 + 0x3c);
    pp_Var23 = (_func_void_int_uint8_t_ptr_uint8_t_ptr_int16_t_ptr_int16_t_ptr_int_int_int_int_int_int_int64_t_ptr_int64_t_ptr_aom_bit_depth_t
                **)&av1_compute_stats;
  }
  else {
    aVar4 = *(aom_bit_depth_t *)(lVar26 + 0x48);
    pp_Var23 = &av1_compute_stats_highbd;
  }
  iVar10 = (int)uVar52;
  (**pp_Var23)(iVar10,*(uint8_t **)((long)priv + 0x40),*(uint8_t **)((long)priv + 0x50),
               *(int16_t **)((long)priv + 0x120),*(int16_t **)((long)priv + 0x128),limits->h_start,
               limits->h_end,limits->v_start,limits->v_end,*(int *)((long)priv + 0x48),
               *(int *)((long)priv + 0x58),M,H,aVar4);
  uVar36 = uVar52 >> 1;
  n = (uint)uVar36;
  uVar13 = n ^ 3;
  uVar24 = (ulong)uVar13;
  uVar31 = 0;
  do {
    iVar15 = *(int *)(wiener_decompose_sep_sym_init_filt + (ulong)(uVar13 << 2) + uVar31 * 4);
    hfilter[uVar31] = iVar15 << 9;
    vfilter[uVar31] = iVar15 << 9;
    uVar31 = uVar31 + 1;
  } while (uVar52 != uVar31);
  uVar29 = iVar10 * iVar10;
  uVar31 = (ulong)(uint)(iVar10 * 8);
  ppiVar34 = Hc;
  piVar41 = H;
  uVar43 = 0;
  do {
    Mc[uVar43] = M + uVar43 * uVar52;
    uVar46 = 0;
    piVar45 = piVar41;
    do {
      *(int64_t **)((long)ppiVar34 + uVar46) = piVar45;
      uVar46 = uVar46 + 8;
      piVar45 = (int64_t *)((long)piVar45 + uVar31);
    } while (uVar31 != uVar46);
    uVar43 = uVar43 + 1;
    ppiVar34 = (int64_t **)((long)ppiVar34 + uVar31);
    piVar41 = (int64_t *)((long)piVar41 + (ulong)(uVar29 * iVar10 * 8));
  } while (uVar43 != uVar52);
  uVar14 = n + 1;
  uVar30 = (n + 2) * n;
  iVar15 = uVar14 * n;
  uVar31 = (ulong)(n * 8);
  lVar33 = uVar31 + 8;
  uVar16 = (iVar10 - n) - 2;
  iVar20 = 1;
  do {
    A[0] = 0;
    A[1] = 0;
    A[2] = 0;
    A[3] = 0;
    B[0] = 0;
    B[1] = 0;
    B[2] = 0;
    B[3] = 0;
    B[4] = 0;
    B[5] = 0;
    B[6] = 0;
    B[7] = 0;
    B[8] = 0;
    B[9] = 0;
    B[10] = 0;
    B[0xb] = 0;
    B[0xc] = 0;
    B[0xd] = 0;
    B[0xe] = 0;
    B[0xf] = 0;
    uVar43 = 0;
    do {
      piVar41 = Mc[uVar43];
      iVar18 = hfilter[uVar43];
      uVar46 = 0;
      iVar39 = iVar10 + -1;
      do {
        iVar44 = (int)uVar46;
        if (uVar36 < uVar46) {
          iVar44 = iVar39;
        }
        lVar47 = piVar41[uVar46] * (long)iVar18;
        lVar26 = lVar47 + 0xffff;
        if (-1 < lVar47) {
          lVar26 = lVar47;
        }
        A[iVar44] = A[iVar44] + (lVar26 >> 0x10);
        uVar46 = uVar46 + 1;
        iVar39 = iVar39 + -1;
      } while (uVar46 != uVar52);
      uVar43 = uVar43 + 1;
    } while (uVar43 != uVar52);
    uVar43 = 0;
    do {
      iVar18 = hfilter[uVar43];
      iVar39 = iVar18 + 0xffff;
      if (-1 < iVar18) {
        iVar39 = iVar18;
      }
      b1[uVar43] = iVar39 >> 0x10;
      b2[uVar43] = iVar18 % 0x10000;
      uVar43 = uVar43 + 1;
    } while (uVar52 != uVar43);
    uVar43 = 0;
    do {
      iVar18 = hfilter[uVar43];
      uVar46 = 0;
      do {
        piVar41 = Hc[uVar43 + uVar46 * uVar52];
        iVar39 = b1[uVar46];
        iVar44 = b2[uVar46];
        uVar25 = 0;
        do {
          uVar48 = ~(uint)uVar25 + iVar10;
          if (uVar25 <= uVar36) {
            uVar48 = (uint)uVar25;
          }
          uVar35 = 0;
          iVar17 = iVar10 + -1;
          do {
            iVar40 = (int)uVar35;
            if (uVar36 < uVar35) {
              iVar40 = iVar17;
            }
            lVar47 = piVar41[uVar35] * (long)iVar18;
            lVar26 = lVar47 + 0xffff;
            if (-1 < lVar47) {
              lVar26 = lVar47;
            }
            lVar38 = (lVar26 >> 0x10) * (long)iVar44;
            lVar47 = lVar38 + 0xffff;
            if (-1 < lVar38) {
              lVar47 = lVar38;
            }
            iVar40 = iVar40 * uVar14 + uVar48;
            B[iVar40] = (lVar26 >> 0x10) * (long)iVar39 + B[iVar40] + (lVar47 >> 0x10);
            uVar35 = uVar35 + 1;
            iVar17 = iVar17 + -1;
          } while (uVar35 != uVar52);
          uVar25 = uVar25 + 1;
          piVar41 = (int64_t *)((long)piVar41 + (ulong)(uVar29 * 8));
        } while (uVar25 != uVar52);
        uVar46 = uVar46 + 1;
      } while (uVar46 != uVar52);
      uVar43 = uVar43 + 1;
    } while (uVar43 != uVar52);
    lVar26 = B[uVar30];
    uVar43 = 0;
    plVar32 = (long *)((long)B + uVar31);
    do {
      A[uVar43] = (A[uVar43] - *plVar32) + (lVar26 - A[uVar36]) * 2;
      uVar43 = uVar43 + 1;
      plVar32 = (long *)((long)plVar32 + lVar33);
    } while (uVar36 != uVar43);
    piVar41 = B;
    uVar43 = 0;
    do {
      uVar46 = 0;
      do {
        piVar41[uVar46] =
             piVar41[uVar46] +
             B[iVar15 + n] * 4 +
             (*(long *)((long)B + uVar46 * 8 + (ulong)(uint)(iVar15 * 8)) +
             B[uVar43 * uVar14 + uVar36]) * -2;
        uVar46 = uVar46 + 1;
      } while (uVar36 != uVar46);
      uVar43 = uVar43 + 1;
      piVar41 = (int64_t *)((long)piVar41 + lVar33);
    } while (uVar43 != uVar36);
    iVar18 = linsolve_wiener(n,B,uVar14,A,S);
    if (iVar18 != 0) {
      S[uVar36] = 0x10000;
      lVar26 = 1;
      plVar32 = S + uVar16;
      do {
        lVar47 = *plVar32;
        *(long *)((long)S + lVar26 * 8 + uVar31) = lVar47;
        S[uVar36] = S[uVar36] + lVar47 * -2;
        lVar26 = lVar26 + 1;
        plVar32 = plVar32 + -1;
      } while (uVar52 - uVar36 != lVar26);
      uVar43 = 0;
      do {
        lVar26 = S[uVar43];
        if (0x1ffffffe < lVar26) {
          lVar26 = 0x1fffffff;
        }
        if (lVar26 < -0x1fffffff) {
          lVar26 = -0x20000000;
        }
        vfilter[uVar43] = (int32_t)lVar26;
        uVar43 = uVar43 + 1;
      } while (uVar52 != uVar43);
    }
    A[0] = 0;
    A[1] = 0;
    A[2] = 0;
    A[3] = 0;
    B[0] = 0;
    B[1] = 0;
    B[2] = 0;
    B[3] = 0;
    B[4] = 0;
    B[5] = 0;
    B[6] = 0;
    B[7] = 0;
    B[8] = 0;
    B[9] = 0;
    B[10] = 0;
    B[0xb] = 0;
    B[0xc] = 0;
    B[0xd] = 0;
    B[0xe] = 0;
    B[0xf] = 0;
    uVar43 = 0;
    do {
      uVar48 = ~(uint)uVar43 + iVar10;
      if (uVar43 <= uVar36) {
        uVar48 = (uint)uVar43;
      }
      iVar42 = A[(int)uVar48];
      uVar46 = 0;
      do {
        lVar47 = (long)vfilter[uVar46] * Mc[uVar43][uVar46];
        lVar26 = lVar47 + 0xffff;
        if (-1 < lVar47) {
          lVar26 = lVar47;
        }
        iVar42 = iVar42 + (lVar26 >> 0x10);
        uVar46 = uVar46 + 1;
      } while (uVar52 != uVar46);
      A[(int)uVar48] = iVar42;
      uVar43 = uVar43 + 1;
    } while (uVar43 != uVar52);
    uVar43 = 0;
    do {
      iVar18 = vfilter[uVar43];
      iVar39 = iVar18 + 0xffff;
      if (-1 < iVar18) {
        iVar39 = iVar18;
      }
      b1[uVar43] = iVar39 >> 0x10;
      b2[uVar43] = iVar18 % 0x10000;
      uVar43 = uVar43 + 1;
    } while (uVar52 != uVar43);
    uVar43 = 0;
    do {
      uVar48 = ~(uint)uVar43 + iVar10;
      if (uVar43 <= uVar36) {
        uVar48 = (uint)uVar43;
      }
      uVar46 = 0;
      do {
        uVar19 = ~(uint)uVar46 + iVar10;
        if (uVar46 <= uVar36) {
          uVar19 = (uint)uVar46;
        }
        iVar18 = uVar19 * uVar14 + uVar48;
        piVar41 = Hc[uVar43 * uVar52 + uVar46];
        iVar42 = B[iVar18];
        uVar25 = 0;
        do {
          uVar35 = 0;
          do {
            lVar47 = piVar41[uVar35] * (long)vfilter[uVar25];
            lVar26 = lVar47 + 0xffff;
            if (-1 < lVar47) {
              lVar26 = lVar47;
            }
            lVar38 = (long)b2[uVar35] * (lVar26 >> 0x10);
            lVar47 = lVar38 + 0xffff;
            if (-1 < lVar38) {
              lVar47 = lVar38;
            }
            iVar42 = iVar42 + (long)b1[uVar35] * (lVar26 >> 0x10) + (lVar47 >> 0x10);
            uVar35 = uVar35 + 1;
          } while (uVar52 != uVar35);
          uVar25 = uVar25 + 1;
          piVar41 = (int64_t *)((long)piVar41 + (ulong)(uVar29 * 8));
        } while (uVar25 != uVar52);
        B[iVar18] = iVar42;
        uVar46 = uVar46 + 1;
      } while (uVar46 != uVar52);
      uVar43 = uVar43 + 1;
    } while (uVar43 != uVar52);
    lVar26 = B[uVar30];
    uVar43 = 0;
    plVar32 = (long *)((long)B + uVar31);
    do {
      A[uVar43] = (A[uVar43] - *plVar32) + (lVar26 - A[uVar36]) * 2;
      uVar43 = uVar43 + 1;
      plVar32 = (long *)((long)plVar32 + lVar33);
    } while (uVar36 != uVar43);
    piVar41 = B;
    uVar43 = 0;
    do {
      uVar46 = 0;
      do {
        piVar41[uVar46] =
             piVar41[uVar46] +
             B[iVar15 + n] * 4 +
             (*(long *)((long)B + uVar46 * 8 + (ulong)(uint)(iVar15 * 8)) +
             B[uVar43 * uVar14 + uVar36]) * -2;
        uVar46 = uVar46 + 1;
      } while (uVar36 != uVar46);
      uVar43 = uVar43 + 1;
      piVar41 = (int64_t *)((long)piVar41 + lVar33);
    } while (uVar43 != uVar36);
    iVar18 = linsolve_wiener(n,B,uVar14,A,S);
    if (iVar18 != 0) {
      S[uVar36] = 0x10000;
      lVar26 = 1;
      plVar32 = S + uVar16;
      do {
        lVar47 = *plVar32;
        *(long *)((long)S + lVar26 * 8 + uVar31) = lVar47;
        S[uVar36] = S[uVar36] + lVar47 * -2;
        lVar26 = lVar26 + 1;
        plVar32 = plVar32 + -1;
      } while (uVar52 - uVar36 != lVar26);
      uVar43 = 0;
      do {
        lVar26 = S[uVar43];
        if (0x1ffffffe < lVar26) {
          lVar26 = 0x1fffffff;
        }
        if (lVar26 < -0x1fffffff) {
          lVar26 = -0x20000000;
        }
        hfilter[uVar43] = (int32_t)lVar26;
        uVar43 = uVar43 + 1;
      } while (uVar52 != uVar43);
    }
    iVar20 = iVar20 + 1;
  } while (iVar20 != 5);
  B[1] = 0;
  B[6] = 0;
  B[7] = 0;
  B[4] = 0;
  B[5] = 0;
  B[2] = 0;
  B[3] = 0;
  B[0] = 1;
  uVar31 = 0;
  do {
    lVar33 = (long)vfilter[uVar31] * 0x80;
    if ((long)vfilter[uVar31] < 0) {
      lVar26 = lVar33 + 0x7fff;
      if (-1 < lVar33 + -0x8000) {
        lVar26 = lVar33 + -0x8000;
      }
      uVar28 = (undefined2)((ulong)lVar26 >> 0x10);
    }
    else {
      uVar28 = (undefined2)((ulong)(lVar33 + 0x8000) >> 0x10);
    }
    *(undefined2 *)((long)B + uVar31 * 2 + 0x10) = uVar28;
    uVar31 = uVar31 + 1;
  } while (uVar36 != uVar31);
  if (iVar21 != 0 || iVar3 != 0) {
    uVar56 = (ushort)(8 < (short)B[2]) * 8 | (ushort)(8 >= (short)B[2]) * (short)B[2];
    uVar53 = (ushort)(0x2e < B[2]._2_2_) * 0x2e | (ushort)(0x2e >= B[2]._2_2_) * B[2]._2_2_;
    uVar53 = (ushort)((short)uVar53 < -0x11) * -0x11 | ((short)uVar53 >= -0x11) * uVar53;
    uVar14 = CONCAT22(uVar53,(ushort)((short)uVar56 < -0x17) * -0x17 |
                             ((short)uVar56 >= -0x17) * uVar56);
    B[2] = (ulong)uVar14 << 0x10;
    uVar54 = 0;
  }
  else {
    uVar53 = (ushort)(10 < (short)B[2]) * 10 | (ushort)(10 >= (short)B[2]) * (short)B[2];
    uVar56 = (ushort)(8 < B[2]._2_2_) * 8 | (ushort)(8 >= B[2]._2_2_) * B[2]._2_2_;
    uVar57 = (ushort)((short)uVar56 < -0x17) * -0x17 | ((short)uVar56 >= -0x17) * uVar56;
    uVar54 = CONCAT22(uVar57,(ushort)((short)uVar53 < -5) * -5 | ((short)uVar53 >= -5) * uVar53);
    uVar56 = 0x2e;
    if ((short)B[2]._4_2_ < 0x2e) {
      uVar56 = B[2]._4_2_;
    }
    uVar53 = 0xffef;
    if (-0x11 < (short)uVar56) {
      uVar53 = uVar56;
    }
    B[2]._0_6_ = CONCAT24(uVar53,uVar54);
    B[2] = CONCAT26(0,(uint6)B[2]);
    uVar14 = (uint)uVar57;
  }
  B[3] = CONCAT62(CONCAT42(CONCAT22(B[3]._6_2_,(short)uVar54),(short)uVar14),uVar53);
  B[2] = CONCAT26((uVar53 + (short)uVar14 + (short)uVar54) * -2,(uint6)B[2]);
  uVar31 = 0;
  do {
    lVar33 = (long)hfilter[uVar31] * 0x80;
    if ((long)hfilter[uVar31] < 0) {
      lVar26 = lVar33 + 0x7fff;
      if (-1 < lVar33 + -0x8000) {
        lVar26 = lVar33 + -0x8000;
      }
      uVar28 = (undefined2)((ulong)lVar26 >> 0x10);
    }
    else {
      uVar28 = (undefined2)((ulong)(lVar33 + 0x8000) >> 0x10);
    }
    *(undefined2 *)((long)B + uVar31 * 2 + 0x20) = uVar28;
    uVar31 = uVar31 + 1;
  } while (uVar36 != uVar31);
  if (iVar21 != 0 || iVar3 != 0) {
    uVar56 = (ushort)(8 < (short)B[4]) * 8 | (ushort)(8 >= (short)B[4]) * (short)B[4];
    uVar53 = (ushort)(0x2e < B[4]._2_2_) * 0x2e | (ushort)(0x2e >= B[4]._2_2_) * B[4]._2_2_;
    uVar53 = (ushort)((short)uVar53 < -0x11) * -0x11 | ((short)uVar53 >= -0x11) * uVar53;
    uVar14 = CONCAT22(uVar53,(ushort)((short)uVar56 < -0x17) * -0x17 |
                             ((short)uVar56 >= -0x17) * uVar56);
    B[4] = (ulong)uVar14 << 0x10;
    uVar54 = 0;
  }
  else {
    uVar53 = (ushort)(10 < (short)B[4]) * 10 | (ushort)(10 >= (short)B[4]) * (short)B[4];
    uVar56 = (ushort)(8 < B[4]._2_2_) * 8 | (ushort)(8 >= B[4]._2_2_) * B[4]._2_2_;
    uVar57 = (ushort)((short)uVar56 < -0x17) * -0x17 | ((short)uVar56 >= -0x17) * uVar56;
    uVar54 = CONCAT22(uVar57,(ushort)((short)uVar53 < -5) * -5 | ((short)uVar53 >= -5) * uVar53);
    uVar56 = 0x2e;
    if ((short)B[4]._4_2_ < 0x2e) {
      uVar56 = B[4]._4_2_;
    }
    uVar53 = 0xffef;
    if (-0x11 < (short)uVar56) {
      uVar53 = uVar56;
    }
    B[4]._0_6_ = CONCAT24(uVar53,uVar54);
    B[4] = CONCAT26(0,(uint6)B[4]);
    uVar14 = (uint)uVar57;
  }
  B[5] = CONCAT62(CONCAT42(CONCAT22(B[5]._6_2_,(short)uVar54),(short)uVar14),uVar53);
  B[4] = CONCAT26((uVar53 + (short)uVar14 + (short)uVar54) * -2,(uint6)B[4]);
  Mc[0]._6_2_ = 0x80;
  S[0]._6_2_ = 0x80;
  lVar33 = 0xc;
  lVar26 = 0;
  do {
    sVar2 = *(short *)((long)B + lVar26 + 0x10);
    *(short *)((long)S + lVar33) = sVar2;
    *(short *)((long)S + lVar26) = sVar2;
    sVar12 = *(short *)((long)B + lVar26 + 0x20);
    *(short *)((long)Mc + lVar33) = sVar12;
    *(short *)((long)Mc + lVar26) = sVar12;
    S[0]._6_2_ = S[0]._6_2_ + sVar2 * -2;
    Mc[0]._6_2_ = Mc[0]._6_2_ + sVar12 * -2;
    lVar26 = lVar26 + 2;
    lVar33 = lVar33 + -2;
  } while (lVar26 != 6);
  ppiVar34 = Hc;
  uVar36 = 0;
  memset(ppiVar34,0,0xc4);
  do {
    sVar2 = *(short *)((long)Mc + (uVar24 + uVar36) * 2);
    uVar31 = 0;
    do {
      *(int *)((long)ppiVar34 + uVar31 * 4) =
           (int)*(short *)((long)S + uVar31 * 2 + uVar24 * 2) * (int)sVar2;
      uVar31 = uVar31 + 1;
    } while (uVar52 != uVar31);
    uVar36 = uVar36 + 1;
    ppiVar34 = (int64_t **)((long)ppiVar34 + (ulong)(uint)(iVar10 * 4));
  } while (uVar36 != uVar52);
  piVar41 = H;
  uVar52 = 0;
  lVar26 = 0;
  lVar33 = 0;
  do {
    lVar38 = (long)*(int *)((long)Hc + uVar52 * 4);
    lVar47 = M[uVar52] * lVar38;
    uVar36 = 0;
    do {
      lVar37 = (long)*(int *)((long)Hc + uVar36 * 4) * piVar41[uVar36] * lVar38;
      lVar49 = lVar37 + 0xfffffff;
      if (-1 < lVar37) {
        lVar49 = lVar37;
      }
      lVar33 = lVar33 + (lVar49 >> 0x1c);
      uVar36 = uVar36 + 1;
    } while (uVar29 != uVar36);
    lVar38 = lVar47 + 0x3fff;
    if (-1 < lVar47) {
      lVar38 = lVar47;
    }
    lVar26 = lVar26 + (lVar38 >> 0xe);
    uVar52 = uVar52 + 1;
    piVar41 = (int64_t *)((long)piVar41 + (ulong)(uVar29 * 8));
  } while (uVar52 != uVar29);
  if (0 < (lVar33 - H[(uVar29 + 1) * (uVar29 >> 1)]) + (M[uVar29 >> 1] - lVar26) * 2) {
    *(long *)((long)priv + 0xa8) = *(long *)((long)priv + 0xa8) + uVar50;
    *(long *)((long)priv + 0x88) = *(long *)((long)priv + 0x88) + *(long *)((long)priv + 0x60);
    wiener_info[1].vfilter[6] = 0;
    wiener_info[1].vfilter[7] = 0;
    *(undefined8 *)((long)priv + 0x68) = 0x7fffffffffffffff;
    if (*(int *)(*(long *)((long)priv + 0x38) + 0x30) != 2) {
      return;
    }
    *(undefined1 *)((long)priv + 0x78) = 1;
    return;
  }
  lVar33 = try_restoration_unit((RestSearchCtxt *)priv,limits,(RestorationUnitInfo *)B);
  if (*(char *)(*(long *)((long)priv + 0x38) + 0x3a) == '\0') {
    uVar52 = (ulong)(6 - (n + uVar13));
    uVar13 = 4;
    do {
      sVar2 = (short)uVar13;
      sVar12 = sVar2 * 2;
      uVar36 = uVar24;
      do {
        iVar3 = *(int *)(&DAT_005043ec + uVar36 * 4);
        lVar47 = 6 - uVar36;
        bVar51 = true;
        lVar26 = lVar33;
        while (iVar21 = (int)*(short *)((long)B + uVar36 * 2 + 0x20) - uVar13, uVar31 = uVar24,
              iVar3 <= iVar21) {
          *(short *)((long)B + uVar36 * 2 + 0x20) = (short)iVar21;
          psVar1 = (short *)((long)B + lVar47 * 2 + 0x20);
          *psVar1 = *psVar1 - sVar2;
          B[4] = CONCAT26(B[4]._6_2_ + sVar12,(uint6)B[4]);
          lVar33 = try_restoration_unit((RestSearchCtxt *)priv,limits,(RestorationUnitInfo *)B);
          if (lVar26 < lVar33) {
            psVar1 = (short *)((long)B + uVar36 * 2 + 0x20);
            *psVar1 = *psVar1 + sVar2;
            psVar1 = (short *)((long)B + lVar47 * 2 + 0x20);
            *psVar1 = *psVar1 + sVar2;
            B[4] = CONCAT26(B[4]._6_2_ + sVar2 * -2,(uint6)B[4]);
            break;
          }
          bVar51 = false;
          lVar26 = lVar33;
          if (uVar13 != 4) goto LAB_0020328c;
        }
        lVar33 = lVar26;
        if (!bVar51) break;
        iVar3 = *(int *)(&DAT_005043f8 + uVar36 * 4);
        do {
          iVar21 = (int)*(short *)((long)B + uVar36 * 2 + 0x20) + uVar13;
          lVar33 = lVar26;
          if (iVar3 < iVar21) break;
          *(short *)((long)B + uVar36 * 2 + 0x20) = (short)iVar21;
          psVar1 = (short *)((long)B + lVar47 * 2 + 0x20);
          *psVar1 = *psVar1 + sVar2;
          B[4] = CONCAT26(B[4]._6_2_ + sVar2 * -2,(uint6)B[4]);
          lVar33 = try_restoration_unit((RestSearchCtxt *)priv,limits,(RestorationUnitInfo *)B);
          if (lVar26 < lVar33) {
            psVar1 = (short *)((long)B + uVar36 * 2 + 0x20);
            *psVar1 = *psVar1 - sVar2;
            psVar1 = (short *)((long)B + lVar47 * 2 + 0x20);
            *psVar1 = *psVar1 - sVar2;
            B[4] = CONCAT26(B[4]._6_2_ + sVar12,(uint6)B[4]);
            lVar33 = lVar26;
            break;
          }
          lVar26 = lVar33;
        } while (uVar13 == 4);
        uVar36 = uVar36 + 1;
      } while (uVar36 != uVar52);
LAB_0020328c:
      do {
        iVar3 = *(int *)(&DAT_005043ec + uVar31 * 4);
        lVar26 = 6 - uVar31;
        bVar51 = true;
        while (iVar21 = (int)*(short *)((long)B + uVar31 * 2 + 0x10) - uVar13, iVar3 <= iVar21) {
          *(short *)((long)B + uVar31 * 2 + 0x10) = (short)iVar21;
          psVar1 = (short *)((long)B + lVar26 * 2 + 0x10);
          *psVar1 = *psVar1 - sVar2;
          B[2] = CONCAT26(B[2]._6_2_ + sVar12,(uint6)B[2]);
          iVar42 = try_restoration_unit((RestSearchCtxt *)priv,limits,(RestorationUnitInfo *)B);
          if (lVar33 < iVar42) {
            psVar1 = (short *)((long)B + uVar31 * 2 + 0x10);
            *psVar1 = *psVar1 + sVar2;
            psVar1 = (short *)((long)B + lVar26 * 2 + 0x10);
            *psVar1 = *psVar1 + sVar2;
            B[2] = CONCAT26(B[2]._6_2_ + sVar2 * -2,(uint6)B[2]);
            break;
          }
          bVar51 = false;
          lVar33 = iVar42;
          if (uVar13 != 4) goto LAB_00203386;
        }
        if (!bVar51) break;
        iVar3 = *(int *)(&DAT_005043f8 + uVar31 * 4);
        lVar47 = lVar33;
        do {
          iVar21 = (int)*(short *)((long)B + uVar31 * 2 + 0x10) + uVar13;
          lVar33 = lVar47;
          if (iVar3 < iVar21) break;
          *(short *)((long)B + uVar31 * 2 + 0x10) = (short)iVar21;
          psVar1 = (short *)((long)B + lVar26 * 2 + 0x10);
          *psVar1 = *psVar1 + sVar2;
          B[2] = CONCAT26(B[2]._6_2_ + sVar2 * -2,(uint6)B[2]);
          lVar33 = try_restoration_unit((RestSearchCtxt *)priv,limits,(RestorationUnitInfo *)B);
          if (lVar47 < lVar33) {
            psVar1 = (short *)((long)B + uVar31 * 2 + 0x10);
            *psVar1 = *psVar1 - sVar2;
            psVar1 = (short *)((long)B + lVar26 * 2 + 0x10);
            *psVar1 = *psVar1 - sVar2;
            B[2] = CONCAT26(B[2]._6_2_ + sVar12,(uint6)B[2]);
            lVar33 = lVar47;
            break;
          }
          lVar47 = lVar33;
        } while (uVar13 == 4);
        uVar31 = uVar31 + 1;
      } while (uVar31 != uVar52);
LAB_00203386:
      bVar51 = 1 < uVar13;
      uVar13 = uVar13 >> 1;
    } while (bVar51);
  }
  *(long *)((long)priv + 0x68) = lVar33;
  *(int64_t *)wiener_info->hfilter = B[4];
  *(int64_t *)(wiener_info->hfilter + 4) = B[5];
  *(int64_t *)wiener_info->vfilter = B[2];
  *(int64_t *)(wiener_info->vfilter + 4) = B[3];
  iVar3 = *(int *)(lVar5 + 0xb940);
  iVar21 = count_wiener_bits(wiener_win,wiener_info,(WienerInfo *)((long)priv + 0xc0));
  uVar52 = (long)(iVar21 << 9) + (long)iVar3;
  bVar27 = *(char *)(*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x48) * '\x02' - 0x10;
  dVar55 = (double)(*(long *)((long)priv + 0x60) >> (bVar27 & 0x3f)) * 128.0 +
           (double)(int)(uVar50 >> 4) * (double)*(int *)(lVar5 + 0x4218) * 0.001953125;
  dVar6 = (double)(*(long *)((long)priv + 0x68) >> (bVar27 & 0x3f)) * 128.0 +
          (double)(int)(uVar52 >> 4) * (double)*(int *)(lVar5 + 0x4218) * 0.001953125;
  *(uint *)(wiener_info[1].vfilter + 6) = (uint)(dVar6 < dVar55);
  iVar3 = *(int *)(*(long *)((long)priv + 0x38) + 0x30);
  if (iVar3 == 2) {
    bVar51 = dVar55 <= dVar6;
  }
  else {
    if (iVar3 != 1) goto LAB_002034fe;
    bVar51 = dVar55 * 1.01 < dVar6;
  }
  *(bool *)((long)priv + 0x78) = bVar51;
LAB_002034fe:
  if (dVar6 < dVar55) {
    uVar50 = uVar52;
  }
  *(long *)((long)priv + 0x88) =
       *(long *)((long)priv + 0x88) + *(long *)((long)priv + (ulong)(dVar6 < dVar55) * 8 + 0x60);
  *(long *)((long)priv + 0xa8) = *(long *)((long)priv + 0xa8) + uVar50;
  if (dVar6 < dVar55) {
    uVar7 = *(undefined8 *)wiener_info->vfilter;
    uVar8 = *(undefined8 *)(wiener_info->vfilter + 4);
    uVar9 = *(undefined8 *)(wiener_info->hfilter + 4);
    *(undefined8 *)((long)priv + 0xd0) = *(undefined8 *)wiener_info->hfilter;
    *(undefined8 *)((long)priv + 0xd8) = uVar9;
    *(undefined8 *)((WienerInfo *)((long)priv + 0xc0))->vfilter = uVar7;
    *(undefined8 *)((long)priv + 200) = uVar8;
  }
  return;
}

Assistant:

static inline void search_wiener(const RestorationTileLimits *limits,
                                 int rest_unit_idx, void *priv, int32_t *tmpbuf,
                                 RestorationLineBuffers *rlbs,
                                 struct aom_internal_error_info *error_info) {
  (void)tmpbuf;
  (void)rlbs;
  (void)error_info;
  RestSearchCtxt *rsc = (RestSearchCtxt *)priv;
  RestUnitSearchInfo *rusi = &rsc->rusi[rest_unit_idx];

  const MACROBLOCK *const x = rsc->x;
  const int64_t bits_none = x->mode_costs.wiener_restore_cost[0];

  // Skip Wiener search for low variance contents
  if (rsc->lpf_sf->prune_wiener_based_on_src_var) {
    const int scale[3] = { 0, 1, 2 };
    // Obtain the normalized Qscale
    const int qs = av1_dc_quant_QTX(rsc->cm->quant_params.base_qindex, 0,
                                    rsc->cm->seq_params->bit_depth) >>
                   3;
    // Derive threshold as sqr(normalized Qscale) * scale / 16,
    const uint64_t thresh =
        (qs * qs * scale[rsc->lpf_sf->prune_wiener_based_on_src_var]) >> 4;
    const int highbd = rsc->cm->seq_params->use_highbitdepth;
    const uint64_t src_var =
        var_restoration_unit(limits, rsc->src, rsc->plane, highbd);
    // Do not perform Wiener search if source variance is lower than threshold
    // or if the reconstruction error is zero
    int prune_wiener = (src_var < thresh) || (rsc->sse[RESTORE_NONE] == 0);
    if (prune_wiener) {
      rsc->total_bits[RESTORE_WIENER] += bits_none;
      rsc->total_sse[RESTORE_WIENER] += rsc->sse[RESTORE_NONE];
      rusi->best_rtype[RESTORE_WIENER - 1] = RESTORE_NONE;
      rsc->sse[RESTORE_WIENER] = INT64_MAX;
      if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) rsc->skip_sgr_eval = 1;
      return;
    }
  }

  const int wiener_win =
      (rsc->plane == AOM_PLANE_Y) ? WIENER_WIN : WIENER_WIN_CHROMA;

  int reduced_wiener_win = wiener_win;
  if (rsc->lpf_sf->reduce_wiener_window_size) {
    reduced_wiener_win =
        (rsc->plane == AOM_PLANE_Y) ? WIENER_WIN_REDUCED : WIENER_WIN_CHROMA;
  }

  int64_t M[WIENER_WIN2];
  int64_t H[WIENER_WIN2 * WIENER_WIN2];
  int32_t vfilter[WIENER_WIN], hfilter[WIENER_WIN];

#if CONFIG_AV1_HIGHBITDEPTH
  const AV1_COMMON *const cm = rsc->cm;
  if (cm->seq_params->use_highbitdepth) {
    // TODO(any) : Add support for use_downsampled_wiener_stats SF in HBD
    // functions. Optimize intrinsics of HBD design similar to LBD (i.e.,
    // pre-calculate d and s buffers and avoid most of the C operations).
    av1_compute_stats_highbd(reduced_wiener_win, rsc->dgd_buffer,
                             rsc->src_buffer, rsc->dgd_avg, rsc->src_avg,
                             limits->h_start, limits->h_end, limits->v_start,
                             limits->v_end, rsc->dgd_stride, rsc->src_stride, M,
                             H, cm->seq_params->bit_depth);
  } else {
    av1_compute_stats(reduced_wiener_win, rsc->dgd_buffer, rsc->src_buffer,
                      rsc->dgd_avg, rsc->src_avg, limits->h_start,
                      limits->h_end, limits->v_start, limits->v_end,
                      rsc->dgd_stride, rsc->src_stride, M, H,
                      rsc->lpf_sf->use_downsampled_wiener_stats);
  }
#else
  av1_compute_stats(reduced_wiener_win, rsc->dgd_buffer, rsc->src_buffer,
                    rsc->dgd_avg, rsc->src_avg, limits->h_start, limits->h_end,
                    limits->v_start, limits->v_end, rsc->dgd_stride,
                    rsc->src_stride, M, H,
                    rsc->lpf_sf->use_downsampled_wiener_stats);
#endif

  wiener_decompose_sep_sym(reduced_wiener_win, M, H, vfilter, hfilter);

  RestorationUnitInfo rui;
  memset(&rui, 0, sizeof(rui));
  rui.restoration_type = RESTORE_WIENER;
  finalize_sym_filter(reduced_wiener_win, vfilter, rui.wiener_info.vfilter);
  finalize_sym_filter(reduced_wiener_win, hfilter, rui.wiener_info.hfilter);

  // Filter score computes the value of the function x'*A*x - x'*b for the
  // learned filter and compares it against identity filer. If there is no
  // reduction in the function, the filter is reverted back to identity
  if (compute_score(reduced_wiener_win, M, H, rui.wiener_info.vfilter,
                    rui.wiener_info.hfilter) > 0) {
    rsc->total_bits[RESTORE_WIENER] += bits_none;
    rsc->total_sse[RESTORE_WIENER] += rsc->sse[RESTORE_NONE];
    rusi->best_rtype[RESTORE_WIENER - 1] = RESTORE_NONE;
    rsc->sse[RESTORE_WIENER] = INT64_MAX;
    if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) rsc->skip_sgr_eval = 1;
    return;
  }

  rsc->sse[RESTORE_WIENER] =
      finer_search_wiener(rsc, limits, &rui, reduced_wiener_win);
  rusi->wiener = rui.wiener_info;

  if (reduced_wiener_win != WIENER_WIN) {
    assert(rui.wiener_info.vfilter[0] == 0 &&
           rui.wiener_info.vfilter[WIENER_WIN - 1] == 0);
    assert(rui.wiener_info.hfilter[0] == 0 &&
           rui.wiener_info.hfilter[WIENER_WIN - 1] == 0);
  }

  const int64_t bits_wiener =
      x->mode_costs.wiener_restore_cost[1] +
      (count_wiener_bits(wiener_win, &rusi->wiener, &rsc->ref_wiener)
       << AV1_PROB_COST_SHIFT);

  double cost_none = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_none >> 4, rsc->sse[RESTORE_NONE],
      rsc->cm->seq_params->bit_depth);
  double cost_wiener = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_wiener >> 4, rsc->sse[RESTORE_WIENER],
      rsc->cm->seq_params->bit_depth);

  RestorationType rtype =
      (cost_wiener < cost_none) ? RESTORE_WIENER : RESTORE_NONE;
  rusi->best_rtype[RESTORE_WIENER - 1] = rtype;

  // Set 'skip_sgr_eval' based on rdcost ratio of RESTORE_WIENER and
  // RESTORE_NONE or based on best_rtype
  if (rsc->lpf_sf->prune_sgr_based_on_wiener == 1) {
    rsc->skip_sgr_eval = cost_wiener > (1.01 * cost_none);
  } else if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) {
    rsc->skip_sgr_eval = rusi->best_rtype[RESTORE_WIENER - 1] == RESTORE_NONE;
  }

#if DEBUG_LR_COSTING
  // Store ref params for later checking
  lr_ref_params[RESTORE_WIENER][rsc->plane][rest_unit_idx].wiener_info =
      rsc->ref_wiener;
#endif  // DEBUG_LR_COSTING

  rsc->total_sse[RESTORE_WIENER] += rsc->sse[rtype];
  rsc->total_bits[RESTORE_WIENER] +=
      (cost_wiener < cost_none) ? bits_wiener : bits_none;
  if (cost_wiener < cost_none) rsc->ref_wiener = rusi->wiener;
}